

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

int intern_device_id(cubeb_conflict *ctx,char **id)

{
  int iVar1;
  char *pcVar2;
  
  if (ctx == (cubeb_conflict *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                  ,0x95,"int intern_device_id(cubeb *, const char **)");
  }
  if (id != (char **)0x0) {
    pcVar2 = cubeb_strings_intern(ctx->device_ids,*id);
    if (pcVar2 == (char *)0x0) {
      iVar1 = -1;
    }
    else {
      *id = pcVar2;
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("id",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                ,0x96,"int intern_device_id(cubeb *, const char **)");
}

Assistant:

static int
intern_device_id(cubeb * ctx, char const ** id)
{
  char const * interned;

  assert(ctx);
  assert(id);

  interned = cubeb_strings_intern(ctx->device_ids, *id);
  if (!interned) {
    return CUBEB_ERROR;
  }

  *id = interned;

  return CUBEB_OK;
}